

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  BamReaderPrivate *this_00;
  pointer pBVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  int iVar10;
  uint32_t currentBin;
  uint64_t lastOffset;
  uint64_t currentOffset;
  BaiReferenceEntry refEntry;
  string readerError;
  string message;
  string indexFilename;
  uint32_t local_3f4;
  uint64_t local_3f0;
  int local_3e4;
  uint local_3e0;
  int local_3dc;
  uint64_t local_3d8;
  uint64_t local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [8];
  _Rb_tree_node_base local_398;
  size_t local_378;
  BaiLinearOffsetVector BStack_370;
  undefined1 local_358 [8];
  undefined1 auStack_350 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Base_ptr local_338;
  _Base_ptr local_330;
  size_t local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  undefined8 uStack_310;
  ios_base local_2d8 [272];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  char local_1b8 [152];
  int local_120;
  int local_11c;
  ushort local_118;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  this_00 = (this->super_BamIndex).m_reader;
  if ((this_00 == (BamReaderPrivate *)0x0) || (bVar2 = BamReaderPrivate::IsOpen(this_00), !bVar2)) {
    local_358 = (undefined1  [8])(auStack_350 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"BamStandardIndex::Create","");
    local_1c8._M_allocated_capacity = (size_type)local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c8,"could not create index: reader is not open","");
    BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_358,(string *)&local_1c8);
    if ((char *)local_1c8._M_allocated_capacity != local_1b8) {
      operator_delete((void *)local_1c8._M_allocated_capacity);
    }
    if (local_358 == (undefined1  [8])(auStack_350 + 8)) {
      return false;
    }
  }
  else {
    bVar2 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
    if (bVar2) {
      BamReaderPrivate::Filename_abi_cxx11_((string *)local_358,(this->super_BamIndex).m_reader);
      local_1c8._M_allocated_capacity = (size_type)local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p,
                 BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p +
                 BAI_EXTENSION_abi_cxx11_._M_string_length);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                    );
      if ((char *)local_1c8._M_allocated_capacity != local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity);
      }
      if (local_358 != (undefined1  [8])(auStack_350 + 8)) {
        operator_delete((void *)local_358);
      }
      OpenFile(this,(string *)&local_50,ReadWrite);
      local_3e4 = BamReaderPrivate::GetReferenceCount((this->super_BamIndex).m_reader);
      pBVar1 = (this->m_indexFileSummary).
               super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_indexFileSummary).
          super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
          ._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
        (this->m_indexFileSummary).
        super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
      }
      local_358 = (undefined1  [8])0x0;
      auStack_350 = (undefined1  [8])0x0;
      local_348._M_allocated_capacity = 0;
      std::
      vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ::_M_fill_assign(&this->m_indexFileSummary,(long)local_3e4,(value_type *)local_358);
      WriteHeader(this);
      local_3f4 = 0xffffffff;
      local_3f0 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
      local_3d8 = local_3f0;
      BamAlignment::BamAlignment((BamAlignment *)&local_1c8);
      local_398._M_left = &local_398;
      local_3a8._0_4_ = -1;
      local_398._M_color = _S_red;
      local_398._M_parent = (_Base_ptr)0x0;
      local_378 = 0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3d0 = local_3f0;
      local_3e0 = local_3f4;
      uVar7 = 0xffffffff;
      iVar10 = -1;
      iVar9 = -1;
      local_3dc = -1;
      local_398._M_right = local_398._M_left;
      while( true ) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(this->super_BamIndex).m_reader;
        local_3f0 = local_3d0;
        bVar2 = BamReaderPrivate::LoadNextAlignment
                          ((BamReaderPrivate *)paVar8,(BamAlignment *)&local_1c8);
        if (!bVar2) break;
        if (iVar9 == local_120) {
          if (local_11c < local_3dc) {
            paVar8 = &local_3c8.field_2;
            local_3c8._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"");
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_358,(string *)&local_3c8,_S_out|_S_in);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar8) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(auStack_350 + 8),"BAM file is not properly sorted by coordinate",
                       0x2d);
            std::ios::widen((char)*(undefined8 *)(local_348._M_allocated_capacity - 0x18) +
                            (char)auStack_350 + '\b');
            std::ostream::put((char)auStack_350 + '\b');
            poVar5 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"Current alignment position: ",0x1c);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_11c);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," < previous alignment position: ",0x20);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_3dc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," on reference ID: ",0x12);
            plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,local_120);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            local_3c8._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3c8,"BamStandardIndex::Create","");
            std::__cxx11::stringbuf::str();
            BamIndex::SetErrorString(&this->super_BamIndex,&local_3c8,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar8) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
            std::ios_base::~ios_base(local_2d8);
            bVar2 = false;
            goto LAB_00140ad7;
          }
        }
        else {
          if (iVar9 == -1) {
            if (0 < local_120) {
              iVar9 = 0;
              do {
                local_358._0_4_ = iVar9;
                local_348._M_allocated_capacity =
                     local_348._M_allocated_capacity & 0xffffffff00000000;
                local_348._8_8_ = 0;
                local_338 = (_Base_ptr)(auStack_350 + 8);
                aStack_320._8_8_ = 0;
                uStack_310 = 0;
                local_328 = 0;
                aStack_320._M_allocated_capacity = 0;
                local_330 = local_338;
                WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
                WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
                if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                  operator_delete((void *)aStack_320._M_allocated_capacity);
                }
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)auStack_350;
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                             *)paVar8);
                iVar9 = iVar9 + 1;
              } while (iVar9 < local_120);
            }
          }
          else {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)paVar8,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                       &local_3f0);
            WriteBins(this,(int *)local_3a8,(BaiBinMap *)local_3a0);
            WriteLinearOffsets(this,(int *)local_3a8,&BStack_370);
            local_3a8._0_4_ = -1;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_3a0;
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                     *)paVar8);
            if (BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start) {
              BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            iVar9 = iVar9 + 1;
            if (iVar9 < local_120) {
              do {
                local_358._0_4_ = iVar9;
                local_348._M_allocated_capacity =
                     local_348._M_allocated_capacity & 0xffffffff00000000;
                local_348._8_8_ = 0;
                local_338 = (_Base_ptr)(auStack_350 + 8);
                aStack_320._8_8_ = 0;
                uStack_310 = 0;
                local_328 = 0;
                aStack_320._M_allocated_capacity = 0;
                local_330 = local_338;
                WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
                WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
                if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                  operator_delete((void *)aStack_320._M_allocated_capacity);
                }
                paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)auStack_350;
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                             *)auStack_350);
                iVar9 = iVar9 + 1;
              } while (iVar9 < local_120);
            }
            local_3d8 = local_3d0;
            local_3f4 = (uint32_t)local_118;
            iVar10 = local_120;
            local_3e0 = local_3f4;
          }
          local_3a8._0_4_ = local_120;
          uVar7 = 0xffffffff;
          iVar9 = local_120;
        }
        if ((-1 < local_120) && (local_118 < 0x1249)) {
          paVar8 = &local_1c8;
          iVar3 = BamAlignment::GetEndPosition((BamAlignment *)paVar8,false,false);
          local_358._0_4_ = iVar3;
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)paVar8,&BStack_370,&local_11c,(int *)local_358,&local_3f0);
        }
        if (uVar7 != local_118) {
          if (local_3e0 != 0xffffffff) {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)paVar8,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                       &local_3f0);
          }
          local_3d8 = local_3d0;
          uVar7 = (uint)local_118;
          iVar10 = local_120;
          local_3f4 = uVar7;
          local_3e0 = uVar7;
          if (local_120 < 0) break;
        }
        iVar4 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        if (iVar4 <= (long)local_3d0) {
          local_358 = (undefined1  [8])(auStack_350 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,"BamStandardIndex::Create","");
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3c8,"calculating offsets failed","");
          BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_358,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if (local_358 != (undefined1  [8])(auStack_350 + 8)) {
            operator_delete((void *)local_358);
          }
          bVar2 = false;
          goto LAB_00140ad7;
        }
        local_3d0 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        local_3dc = local_11c;
      }
      if (local_3f0 != local_3d8) {
        SaveAlignmentChunkToBin
                  ((BamStandardIndex *)paVar8,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                   &local_3f0);
        WriteBins(this,(int *)local_3a8,(BaiBinMap *)local_3a0);
        WriteLinearOffsets(this,(int *)local_3a8,&BStack_370);
      }
      iVar10 = iVar10 + 1;
      bVar2 = true;
      if (iVar10 < local_3e4) {
        do {
          local_358._0_4_ = iVar10;
          local_348._M_allocated_capacity = local_348._M_allocated_capacity & 0xffffffff00000000;
          local_348._8_8_ = 0;
          local_338 = (_Base_ptr)(auStack_350 + 8);
          aStack_320._8_8_ = 0;
          uStack_310 = 0;
          local_328 = 0;
          aStack_320._M_allocated_capacity = 0;
          local_330 = local_338;
          WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
          WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
          if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)aStack_320._M_allocated_capacity);
          }
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                       *)auStack_350);
          iVar10 = iVar10 + 1;
        } while (local_3e4 != iVar10);
        bVar2 = true;
      }
LAB_00140ad7:
      if (BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                   *)local_3a0);
      BamAlignment::~BamAlignment((BamAlignment *)&local_1c8);
      if ((char *)local_50._M_allocated_capacity != local_40) {
        operator_delete((void *)local_50._M_allocated_capacity);
      }
      if (!bVar2) {
        return false;
      }
      bVar2 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
      if (bVar2) {
        return true;
      }
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                     ,"could not create index: \n\t",(string *)local_358);
      local_3a8 = (undefined1  [8])&local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_3a8,(string *)&local_1c8);
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8);
      }
      if ((char *)local_1c8._M_allocated_capacity != local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity);
      }
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8
                     ,"could not create index: \n\t",(string *)local_358);
      local_3a8 = (undefined1  [8])&local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_3a8,(string *)&local_1c8);
      if (local_3a8 != (undefined1  [8])&local_398) {
        operator_delete((void *)local_3a8);
      }
      if ((char *)local_1c8._M_allocated_capacity != local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity);
      }
    }
    if (local_358 == (undefined1  [8])(auStack_350 + 8)) {
      return false;
    }
  }
  operator_delete((void *)local_358);
  return false;
}

Assistant:

bool BamStandardIndex::Create(void) {

    // skip if BamReader is invalid or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin    = defaultValue;
        uint32_t lastBin       = defaultValue;
        int32_t  currentRefID  = defaultValue;
        int32_t  lastRefID     = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset    = currentOffset;
        int32_t  lastPosition  = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while ( m_reader->LoadNextAlignment(al) ) {

            // changed to new reference
            if ( lastRefID != al.RefID ) {

                // if not first reference, save previous reference data
                if ( lastRefID != (int32_t)defaultValue ) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for ( int i = lastRefID+1; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin    = al.Bin;
                    lastBin       = al.Bin;
                    currentRefID  = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for ( int i = 0; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID   = al.RefID;
                lastBin     = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if ( lastPosition > al.Position ) {
                stringstream s("");
                s << "BAM file is not properly sorted by coordinate" << endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ( (al.RefID >= 0) && (al.Bin < 4681) )
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(), lastOffset);

            // changed to new BAI bin
            if ( al.Bin != lastBin ) {

                // if not first bin on reference, save previous bin data
                if ( currentBin != defaultValue )
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin    = al.Bin;
                lastBin       = al.Bin;
                currentRefID  = al.RefID;

                // if invalid RefID, break out
                if ( currentRefID < 0 )
                    break;
            }

            // make sure that current file pointer is beyond lastOffset
            if ( m_reader->Tell() <= (int64_t)lastOffset ) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset   = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if ( lastOffset != currentOffset ) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for ( int i = currentRefID+1; i < numReferences; ++i ) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch ( BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}